

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

boolean create_room(level *lev,xchar x,xchar y,xchar w,xchar h,xchar xal,xchar yal,xchar rtype,
                   xchar rlit)

{
  char cVar1;
  char cVar2;
  xchar xVar3;
  byte bVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  nhrect *r1;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  char cVar16;
  char cVar17;
  int iVar18;
  int iVar19;
  short sVar20;
  int iVar21;
  bool vault;
  bool bVar22;
  xchar yabs;
  xchar xabs;
  xchar dy;
  xchar dx;
  nhrect r2;
  uint local_98;
  char local_48;
  char local_40;
  
  if (rtype == -1) {
    rtype = '\0';
  }
  vault = rtype == '\x04';
  iVar15 = vault + 4;
  iVar11 = vault + 3;
  if (rlit == -1) {
    bVar4 = depth(&lev->z);
    uVar6 = mt_random();
    rlit = '\0';
    if (uVar6 % (uint)(byte)(((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7)) + 1) < 10) {
      uVar6 = mt_random();
      rlit = 0x3531dec < uVar6 * 0x3f2b3885;
    }
  }
  uVar6 = 0;
  iVar7 = vault + 5;
  iVar8 = vault + 4;
  do {
    iVar18 = (int)w;
    iVar13 = (int)h;
    if ((char)(w & xal & y & x & yal) < '\0' || rtype == '\x04') {
      r1 = rnd_rect();
      if (r1 == (nhrect *)0x0) goto LAB_0024b5dc;
      cVar17 = r1->hx;
      iVar14 = (int)cVar17;
      cVar1 = r1->hy;
      cVar16 = r1->lx;
      iVar19 = (int)cVar16;
      cVar2 = r1->ly;
      if (rtype == '\x04') {
        dy = '\x01';
        dx = '\x01';
        iVar21 = iVar14 - iVar19;
        bVar4 = 1;
      }
      else {
        iVar21 = iVar14 - iVar19;
        uVar10 = mt_random();
        bVar4 = (char)(uVar10 % ((uint)(0x1c < iVar21) * 4 + 8)) + 2;
        dx = bVar4;
        uVar10 = mt_random();
        dy = ((byte)uVar10 & 3) + 2;
        if (0x32 < (byte)(dy * bVar4)) {
          dy = (xchar)(0x32 / bVar4);
        }
      }
      xVar3 = dy;
      iVar9 = iVar7;
      if (cVar17 < 'O') {
        iVar9 = iVar15 * 2;
      }
      if (cVar16 < '\x01') {
        iVar9 = iVar7;
      }
      if ((int)(iVar9 + (uint)bVar4 + 3) <= iVar21) {
        iVar21 = iVar8;
        if (cVar1 < '\x14') {
          iVar21 = iVar11 * 2;
        }
        if (cVar2 < '\x01') {
          iVar21 = iVar8;
        }
        if ((int)(iVar21 + (uint)(byte)dy + 3) <= (int)cVar1 - (int)cVar2) {
          local_40 = (char)iVar15;
          cVar17 = '\x03';
          if ('\0' < cVar16) {
            cVar17 = local_40;
          }
          iVar12 = 3;
          if ('\0' < cVar16) {
            iVar12 = iVar19;
          }
          uVar10 = mt_random();
          xabs = SUB161(ZEXT416(uVar10) %
                        SEXT816((long)(int)((iVar14 - (iVar12 + iVar9 + (uint)bVar4)) + 1)),0) +
                 cVar17 + cVar16;
          local_48 = (char)iVar11;
          cVar17 = '\x02';
          if ('\0' < cVar2) {
            cVar17 = local_48;
          }
          iVar14 = 2;
          if ('\0' < cVar2) {
            iVar14 = (int)cVar2;
          }
          local_98 = (uint)(byte)xVar3;
          uVar10 = mt_random();
          cVar17 = SUB161(ZEXT416(uVar10) %
                          SEXT816((long)(int)(((int)cVar1 - (iVar14 + local_98 + iVar21)) + 1)),0) +
                   cVar17 + cVar2;
          yabs = cVar17;
          if (('\x13' < cVar1 && cVar2 == '\0') &&
             (((iVar14 = lev->nroom, (long)iVar14 == 0 ||
               (uVar10 = mt_random(), SUB168(ZEXT416(uVar10) % SEXT816((long)iVar14),0) == 0)) &&
              (local_98 = (uint)(byte)xVar3, 10 < (int)((int)cVar17 + local_98))))) {
            uVar10 = mt_random();
            yabs = (char)uVar10 + (char)(uVar10 / 3) * -3 + '\x02';
            if ((1 < (byte)xVar3) && (lev->nroom < 4)) {
              dy = xVar3 + -1;
            }
          }
          bVar5 = check_room(lev,&xabs,&dx,&yabs,&dy,vault);
          if (bVar5 != '\0') {
            iVar18 = dx + 1;
            iVar13 = dy + 1;
            r2.lx = xabs + -1;
            r2.ly = yabs + -1;
            r2.hx = xabs + (char)iVar18;
            r2.hy = (char)iVar13 + yabs;
            goto LAB_0024b59c;
          }
        }
      }
      r1 = (nhrect *)0x0;
    }
    else {
      sVar20 = (short)y;
      bVar22 = (char)(y & x) < '\0';
      iVar14 = (int)x;
      if (bVar22) {
        uVar10 = mt_random();
        iVar14 = uVar10 % 5 + 1;
        uVar10 = mt_random();
        sVar20 = (short)(uVar10 % 5) + 1;
      }
      if ((char)(h | w) < '\0') {
        uVar10 = mt_random();
        iVar18 = uVar10 % 0xf + 3;
        uVar10 = mt_random();
        iVar13 = (uVar10 & 7) + 2;
      }
      iVar19 = (int)xal;
      if (xal == -1) {
        uVar10 = mt_random();
        iVar19 = uVar10 % 3 + 1;
      }
      iVar21 = (int)yal;
      if (yal == -1) {
        uVar10 = mt_random();
        iVar21 = uVar10 % 3 + 1;
      }
      uVar10 = (short)((short)(iVar14 << 4) + (short)iVar14 * 0x40 + -0x50) * 0x6667;
      cVar17 = (char)(uVar10 >> 0x11) - (char)((int)uVar10 >> 0x1f);
      xabs = cVar17 + '\x01';
      uVar10 = (short)(sVar20 * 0x15 + -0x15) * 0x6667;
      cVar1 = (char)(uVar10 >> 0x11) - (char)((int)uVar10 >> 0x1f);
      yabs = cVar1 + '\x01';
      cVar16 = (char)iVar18;
      if (iVar19 == 3) {
        xabs = xabs + (char)(((0x10U - iVar18 & 0xffff) >> 0xf) + (0x10U - iVar18) >> 1);
      }
      else if (iVar19 == 5) {
        xabs = (cVar17 - cVar16) + '\x11';
      }
      cVar17 = (char)iVar13;
      if (iVar21 == 3) {
        yabs = yabs + (char)(((4U - iVar13 & 0xffff) >> 0xf) + (4U - iVar13) >> 1);
      }
      else if (iVar21 == 5) {
        yabs = (cVar1 - cVar17) + '\x05';
      }
      if (0x4f < xabs + iVar18) {
        xabs = 'M' - cVar16;
      }
      if (xabs < '\x02') {
        xabs = '\x02';
      }
      if (0x14 < yabs + iVar13) {
        yabs = '\x12' - cVar17;
      }
      if (yabs < '\x02') {
        yabs = '\x02';
      }
      r2.lx = xabs + -1;
      r2.ly = yabs + -1;
      r2.hx = cVar16 + bVar22 + xabs;
      r2.hy = bVar22 + cVar17 + yabs;
      r1 = get_rect(&r2);
    }
    if ((99 < uVar6) || (uVar6 = uVar6 + 1, r1 != (nhrect *)0x0)) {
      if (r1 == (nhrect *)0x0) {
LAB_0024b5dc:
        bVar5 = '\0';
      }
      else {
LAB_0024b59c:
        split_rects(r1,&r2);
        if (rtype == '\x04') {
          iVar11 = lev->nroom;
          lev->rooms[iVar11].lx = xabs;
          lev->rooms[iVar11].ly = yabs;
        }
        else {
          smeq[lev->nroom] = lev->nroom;
          add_room(lev,(int)xabs,(int)yabs,iVar18 + -1 + (int)xabs,iVar13 + -1 + (int)yabs,rlit,
                   rtype,'\0');
        }
        bVar5 = '\x01';
      }
      return bVar5;
    }
  } while( true );
}

Assistant:

boolean create_room(struct level *lev, xchar x, xchar y, xchar w, xchar h,
		    xchar xal, xchar yal, xchar rtype, xchar rlit)
{
	xchar xabs, yabs;
	int wtmp, htmp, xaltmp, yaltmp, xtmp, ytmp;
	struct nhrect *r1 = NULL, r2;
	int trycnt = 0;
	boolean vault = FALSE;
	int xlim = XLIM, ylim = YLIM;

	if (rtype == -1)	/* Is the type random ? */
	    rtype = OROOM;

	if (rtype == VAULT) {
		vault = TRUE;
		xlim++;
		ylim++;
	}

	/* on low levels the room is lit (usually) */
	/* some other rooms may require lighting */

	/* is light state random ? */
	if (rlit == -1)
	    rlit = (rnd(1+abs(depth(&lev->z))) < 11 && rn2(77)) ? TRUE : FALSE;

	/*
	 * Here we will try to create a room. If some parameters are
	 * random we are willing to make several try before we give
	 * it up.
	 */
	do {
		xchar xborder, yborder;
		wtmp = w; htmp = h;
		xtmp = x; ytmp = y;
		xaltmp = xal; yaltmp = yal;

		/* First case : a totaly random room */

		if ((xtmp < 0 && ytmp <0 && wtmp < 0 && xaltmp < 0 &&
		   yaltmp < 0) || vault) {
			xchar hx, hy, lx, ly, dx, dy;
			r1 = rnd_rect(); /* Get a random rectangle */

			if (!r1) /* No more free rectangles ! */
				return FALSE;

			hx = r1->hx;
			hy = r1->hy;
			lx = r1->lx;
			ly = r1->ly;
			if (vault)
			    dx = dy = 1;
			else {
				dx = 2 + rn2((hx-lx > 28) ? 12 : 8);
				dy = 2 + rn2(4);
				if (dx*dy > 50)
				    dy = 50/dx;
			}
			xborder = (lx > 0 && hx < COLNO -1) ? 2*xlim : xlim+1;
			yborder = (ly > 0 && hy < ROWNO -1) ? 2*ylim : ylim+1;
			if (hx-lx < dx + 3 + xborder ||
			   hy-ly < dy + 3 + yborder) {
				r1 = 0;
				continue;
			}
			xabs = lx + (lx > 0 ? xlim : 3)
			    + rn2(hx - (lx>0?lx : 3) - dx - xborder + 1);
			yabs = ly + (ly > 0 ? ylim : 2)
			    + rn2(hy - (ly>0?ly : 2) - dy - yborder + 1);
			if (ly == 0 && hy >= (ROWNO-1) &&
			    (!lev->nroom || !rn2(lev->nroom)) && (yabs+dy > ROWNO/2)) {
			    yabs = rn1(3, 2);
			    if (lev->nroom < 4 && dy>1) dy--;
		        }
			if (!check_room(lev, &xabs, &dx, &yabs, &dy, vault)) {
				r1 = 0;
				continue;
			}
			wtmp = dx+1;
			htmp = dy+1;
			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp;
			r2.hy = yabs + htmp;
		} else {	/* Only some parameters are random */
			int rndpos = 0;
			if (xtmp < 0 && ytmp < 0) { /* Position is RANDOM */
				xtmp = rnd(5);
				ytmp = rnd(5);
				rndpos = 1;
			}
			if (wtmp < 0 || htmp < 0) { /* Size is RANDOM */
				wtmp = rn1(15, 3);
				htmp = rn1(8, 2);
			}
			if (xaltmp == -1) /* Horizontal alignment is RANDOM */
			    xaltmp = rnd(3);
			if (yaltmp == -1) /* Vertical alignment is RANDOM */
			    yaltmp = rnd(3);

			/* Try to generate real (absolute) coordinates here! */

			xabs = (((xtmp-1) * COLNO) / 5) + 1;
			yabs = (((ytmp-1) * ROWNO) / 5) + 1;
			switch (xaltmp) {
			      case LEFT:
				break;
			      case RIGHT:
				xabs += (COLNO / 5) - wtmp;
				break;
			      case CENTER:
				xabs += ((COLNO / 5) - wtmp) / 2;
				break;
			}
			switch (yaltmp) {
			      case TOP:
				break;
			      case BOTTOM:
				yabs += (ROWNO / 5) - htmp;
				break;
			      case CENTER:
				yabs += ((ROWNO / 5) - htmp) / 2;
				break;
			}

			if (xabs + wtmp - 1 > COLNO - 2)
			    xabs = COLNO - wtmp - 3;
			if (xabs < 2)
			    xabs = 2;
			if (yabs + htmp - 1> ROWNO - 2)
			    yabs = ROWNO - htmp - 3;
			if (yabs < 2)
			    yabs = 2;

			/* Try to find a rectangle that fit our room ! */

			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp + rndpos;
			r2.hy = yabs + htmp + rndpos;
			r1 = get_rect(&r2);
		}
	} while (++trycnt <= 100 && !r1);
	if (!r1) {	/* creation of room failed ? */
		return FALSE;
	}
	split_rects(r1, &r2);

	if (!vault) {
		smeq[lev->nroom] = lev->nroom;
		add_room(lev, xabs, yabs, xabs+wtmp-1, yabs+htmp-1,
			 rlit, rtype, FALSE);
	} else {
		lev->rooms[lev->nroom].lx = xabs;
		lev->rooms[lev->nroom].ly = yabs;
	}
	return TRUE;
}